

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O0

void aom_noise_tx_add_energy(aom_noise_tx_t *noise_tx,float *psd)

{
  int iVar1;
  float *pfVar2;
  int iVar3;
  float *c;
  int xb;
  int yb;
  int block_size;
  float *psd_local;
  aom_noise_tx_t *noise_tx_local;
  
  iVar1 = noise_tx->block_size;
  for (yb = 0; yb < iVar1; yb = yb + 1) {
    for (xb = 0; xb <= iVar1 / 2; xb = xb + 1) {
      pfVar2 = noise_tx->tx_block + (yb * iVar1 + xb) * 2;
      iVar3 = yb * iVar1 + xb;
      psd[iVar3] = *pfVar2 * *pfVar2 + pfVar2[1] * pfVar2[1] + psd[iVar3];
    }
  }
  return;
}

Assistant:

void aom_noise_tx_add_energy(const struct aom_noise_tx_t *noise_tx,
                             float *psd) {
  const int block_size = noise_tx->block_size;
  for (int yb = 0; yb < block_size; ++yb) {
    for (int xb = 0; xb <= block_size / 2; ++xb) {
      float *c = noise_tx->tx_block + 2 * (yb * block_size + xb);
      psd[yb * block_size + xb] += c[0] * c[0] + c[1] * c[1];
    }
  }
}